

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode
JsVarDeserializerReadBytes(JsVarDeserializerHandle deserializerHandle,size_t length,void **data)

{
  anon_class_24_3_8aac21c6 fn;
  void **local_28;
  void **data_local;
  size_t length_local;
  JsVarDeserializerHandle deserializerHandle_local;
  
  if (deserializerHandle == (JsVarDeserializerHandle)0x0) {
    deserializerHandle_local._4_4_ = JsErrorNullArgument;
  }
  else if (data == (void **)0x0) {
    deserializerHandle_local._4_4_ = JsErrorNullArgument;
  }
  else {
    fn.length = (size_t *)&data_local;
    fn.deserializerHandle = (JsVarDeserializerHandle *)&length_local;
    fn.data = &local_28;
    local_28 = data;
    data_local = (void **)length;
    length_local = (size_t)deserializerHandle;
    deserializerHandle_local._4_4_ =
         ContextAPINoScriptWrapper_NoRecord<JsVarDeserializerReadBytes::__0>(fn,false,false);
  }
  return deserializerHandle_local._4_4_;
}

Assistant:

CHAKRA_API
JsVarDeserializerReadBytes(_In_ JsVarDeserializerHandle deserializerHandle, _In_ size_t length, _Out_ void **data)
{
    PARAM_NOT_NULL(deserializerHandle);
    PARAM_NOT_NULL(data);
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        ChakraHostDeserializerHandle* deserializer = reinterpret_cast<ChakraHostDeserializerHandle*>(deserializerHandle);
        if (!deserializer->ReadBytes(length, data))
        {
            return JsErrorInvalidArgument;
        }
        return JsNoError;
    });
}